

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  int iVar1;
  uv__queue *q_00;
  uv_handle_t *h;
  uv__queue *q;
  uv__queue queue;
  void *arg_local;
  uv_walk_cb walk_cb_local;
  uv_loop_t *loop_local;
  
  queue.prev = (uv__queue *)arg;
  uv__queue_move(&loop->handle_queue,(uv__queue *)&q);
  while (iVar1 = uv__queue_empty((uv__queue *)&q), iVar1 == 0) {
    q_00 = uv__queue_head((uv__queue *)&q);
    uv__queue_remove(q_00);
    uv__queue_insert_tail(&loop->handle_queue,q_00);
    if (((ulong)q_00[1].prev & 0x10) == 0) {
      (*walk_cb)((uv_handle_t *)(q_00 + -2),queue.prev);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_handle_t* h;

  uv__queue_move(&loop->handle_queue, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_handle_t, handle_queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->handle_queue, q);

    if (h->flags & UV_HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}